

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_knot.cpp
# Opt level: O2

bool ON_GetGrevilleKnotVector
               (int g_stride,double *g,bool bPeriodic,int order,int cv_count,double *knot)

{
  bool bVar1;
  double *pdVar2;
  undefined4 in_register_0000000c;
  ulong uVar3;
  double *pdVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  double **ppdVar8;
  ulong uVar9;
  ulong uVar10;
  undefined4 in_register_00000084;
  undefined8 uVar11;
  uint uVar12;
  ulong uVar13;
  double *pdVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  long lVar18;
  double *memblock;
  bool bVar19;
  double dVar20;
  double dVar21;
  double *apdStack_80 [4];
  double *local_60;
  undefined8 local_58;
  ulong local_50;
  int local_44;
  double local_40;
  uint local_34;
  
  uVar11 = CONCAT44(in_register_00000084,cv_count);
  ppdVar8 = apdStack_80 + 1;
  bVar19 = false;
  bVar1 = false;
  if (((((order < cv_count && order != 2 || !bPeriodic) && (bVar1 = bVar19, order <= cv_count)) &&
       (1 < order)) && ((0 < g_stride && (g != (double *)0x0)))) && (knot != (double *)0x0)) {
    uVar12 = order - 1;
    uVar5 = (ulong)uVar12;
    if (uVar12 == 1) {
      for (uVar5 = 0; (uint)cv_count != uVar5; uVar5 = uVar5 + 1) {
        knot[uVar5] = *g;
        g = g + (uint)g_stride;
      }
      bVar1 = true;
    }
    else {
      dVar21 = 1.0 / (double)(int)uVar12;
      local_44 = order + cv_count + -2;
      uVar16 = (cv_count - order) + 2;
      local_50 = (ulong)(uint)cv_count;
      if (bPeriodic) {
        local_50 = (ulong)uVar16;
        local_60 = (double *)CONCAT44(local_60._4_4_,uVar12 >> 1);
        local_34 = uVar12 * 2;
        lVar18 = (long)(int)(uVar16 + uVar12 * 2);
        apdStack_80[0] = (double *)0x4d8ab7;
        apdStack_80[3] = (double *)CONCAT44(in_register_0000000c,order);
        local_58 = uVar11;
        local_40 = dVar21;
        pdVar2 = (double *)onmalloc(lVar18 * 8);
        iVar15 = (int)apdStack_80[3];
        for (uVar9 = 0; uVar5 != uVar9; uVar9 = uVar9 + 1) {
          pdVar2[uVar9] = (*g - g[(long)(int)uVar16 + -1]) + g[(long)(int)(uVar16 - iVar15) + uVar9]
          ;
        }
        uVar9 = 0;
        iVar17 = (int)local_50;
        uVar10 = 0;
        if (0 < iVar17) {
          uVar10 = local_50 & 0xffffffff;
        }
        for (; uVar10 != uVar9; uVar9 = uVar9 + 1) {
          pdVar2[uVar5 + uVar9] = g[uVar9];
        }
        pdVar4 = g + 1;
        for (lVar6 = (long)(int)(iVar17 + uVar12); lVar6 < lVar18; lVar6 = lVar6 + 1) {
          pdVar2[lVar6] = (g[(long)(int)uVar16 + -1] - *g) + *pdVar4;
          pdVar4 = pdVar4 + 1;
        }
        uVar9 = (ulong)(int)uVar12;
        local_60._0_4_ = -(uVar12 & 1) & (uint)local_60;
        uVar3 = 0;
        uVar10 = (ulong)(uint)(iVar17 + iVar15);
        if (iVar17 + iVar15 < 1) {
          uVar10 = uVar3;
        }
        apdStack_80[0] = (double *)0x1;
        pdVar4 = pdVar2;
        for (; uVar3 != uVar10; uVar3 = uVar3 + 1) {
          dVar21 = pdVar2[uVar3];
          for (uVar13 = 1; uVar5 != uVar13; uVar13 = uVar13 + 1) {
            dVar21 = dVar21 + pdVar4[uVar13];
          }
          dVar21 = dVar21 * local_40;
          if (((uint)local_60 != 0) &&
             (ABS(dVar21 - pdVar2[(uint)local_60 + uVar3]) <=
              (pdVar2[uVar9 + (uVar3 - 1)] - pdVar2[uVar3]) * 1.490116119385e-08)) {
            dVar21 = pdVar2[(uint)local_60 + uVar3];
          }
          pdVar2[uVar3] = dVar21;
          pdVar4 = pdVar4 + 1;
        }
        lVar18 = -((ulong)(uint)(iVar15 * iVar15) * 8 + 0xf & 0x3fffffff0);
        ppdVar8 = (double **)((long)apdStack_80 + lVar18 + 8U);
        uVar5 = (ulong)local_34;
        local_40 = 0.0;
        local_34 = 0;
        pdVar4 = apdStack_80[3];
        memblock = pdVar2;
        apdStack_80[1] = knot;
        apdStack_80[2] = pdVar2;
        local_60 = (double *)ppdVar8;
        local_50 = uVar9;
        for (uVar10 = 0; pdVar14 = local_60, uVar5 != uVar10; uVar10 = uVar10 + 1) {
          dVar21 = *g;
          if (dVar21 < pdVar2[uVar9] || dVar21 == pdVar2[uVar9]) {
            if (dVar21 < pdVar2[uVar9 - 1]) break;
            *(undefined8 *)((long)apdStack_80 + lVar18) = 0x4d8cea;
            ON_EvaluateNurbsBasis((int)pdVar4,pdVar2,dVar21,pdVar14);
            dVar21 = *pdVar14;
            uVar9 = local_50;
            knot = apdStack_80[1];
            pdVar4 = apdStack_80[3];
            memblock = apdStack_80[2];
            if (local_40 < dVar21) {
              local_34 = (uint)uVar10;
              local_40 = dVar21;
            }
          }
          pdVar2 = pdVar2 + 1;
        }
        lVar6 = (long)(int)local_34;
        lVar7 = (long)local_44;
        *(undefined8 *)((long)apdStack_80 + lVar18) = 0x4d8d36;
        memcpy(knot,memblock + lVar6,lVar7 << 3);
        uVar11 = local_58;
        *(undefined8 *)((long)apdStack_80 + lVar18) = 0x4d8d45;
        bVar1 = ON_MakeKnotVectorPeriodic((int)pdVar4,(int)uVar11,knot);
      }
      else {
        if (g < knot + local_44 && knot < g) {
          apdStack_80[0] = (double *)0x4d8b41;
          local_58 = uVar11;
          local_40 = dVar21;
          pdVar2 = (double *)onmalloc((ulong)(uint)cv_count * 8);
          uVar9 = (ulong)(uint)g_stride;
          apdStack_80[0] = (double *)0x1;
          g_stride = 1;
          for (uVar10 = 0; uVar11 = local_58, memblock = pdVar2, dVar21 = local_40,
              (uint)cv_count != uVar10; uVar10 = uVar10 + 1) {
            pdVar2[uVar10] = *g;
            g = g + uVar9;
          }
        }
        else {
          pdVar2 = g;
          memblock = (double *)0x0;
        }
        for (uVar9 = 0; uVar5 != uVar9; uVar9 = uVar9 + 1) {
          knot[uVar9] = *pdVar2;
        }
        bVar1 = true;
        pdVar4 = pdVar2;
        for (lVar18 = (long)(int)uVar12; pdVar4 = pdVar4 + g_stride, lVar18 < (int)uVar11;
            lVar18 = lVar18 + 1) {
          dVar20 = 0.0;
          pdVar14 = pdVar4;
          uVar9 = uVar5;
          while (bVar19 = uVar9 != 0, uVar9 = uVar9 - 1, bVar19) {
            dVar20 = dVar20 + *pdVar14;
            pdVar14 = pdVar14 + g_stride;
          }
          dVar20 = dVar20 * dVar21;
          knot[lVar18] = dVar20;
          if ((dVar20 < knot[lVar18 + -1]) || (dVar20 <= knot[lVar18 - (int)uVar12])) {
            bVar1 = false;
          }
        }
        uVar12 = (int)uVar11 - 1;
        uVar5 = (ulong)uVar12;
        pdVar4 = knot + uVar5;
        for (; (int)uVar5 < local_44; uVar5 = (ulong)((int)uVar5 + 1)) {
          *pdVar4 = pdVar2[(int)(g_stride * uVar12)];
          pdVar4 = pdVar4 + 1;
        }
      }
      if (memblock != (double *)0x0) {
        ppdVar8[-1] = (double *)0x4d8d55;
        onfree(memblock);
      }
    }
  }
  return bVar1;
}

Assistant:

bool ON_GetGrevilleKnotVector( // get knots from Greville abcissa
          int g_stride,     
          const double *g,  // if not periodic, g[cv_count], 
                            // if periodic, g[cv_count-order+2]
                            // usually, g[0] = 0, g[i] = |P[i]-P[i-1]|^q
          bool bPeriodic,
          int order, 
          int cv_count, 
          double* knot
          )
{
  bool rc = false;
  double* p = nullptr;
  int ki, knot_count, g_count, gi, j, degree;
  double k, dd;

  if ( g_stride < 1 || !g || !knot || order < 2 || cv_count < order )
    return false;
  if ( bPeriodic && order == 2 )
    return false;
  if ( bPeriodic && cv_count - order + 2 < 3 )
    return false;

  degree = order-1;
  if ( degree == 1 ) {
    for ( j = 0; j < cv_count; j++ ) {
      knot[j] = g[j*g_stride];
    }
    return true;
  }
  dd = 1.0/degree;
  knot_count = ON_KnotCount( order, cv_count );
  g_count = (bPeriodic) ? cv_count-order+2 : cv_count;

  if ( bPeriodic ) {
    int half_degree = (degree%2) ? degree/2 : 0;
    // step 1: set p[] = fully periodic list of abcissa
    p = (double*)onmalloc((g_count + 2*degree)*sizeof(*p));
    for ( j = 0, gi = g_count-order; j < degree; j++, gi++ ) {
      p[j] = g[0] - g[g_count-1] + g[gi];
    }
    for ( gi = 0, j = degree; gi < g_count; gi++, j++ ) {
      p[j] = g[gi];
    }
    for ( j = g_count+degree, gi = 1; j < g_count+2*degree; j++, gi++ ) {
      p[j] = g[g_count-1] - g[0] + g[gi];
    }

    // step 2: set new p[i] = old (p[i] + ... + p[i+degree-1]) / degree
    for ( j = 0; j < g_count+order; j++ ) {
      k = p[j];
      for ( ki = 1; ki < degree; ki++ ) 
        k += p[j+ki];
      k *= dd;
      if ( half_degree ) {
        // if g[]'s are uniform and degree is odd, then knots = g[]'s
        if ( fabs(k-p[j+half_degree]) <=  ON_SQRT_EPSILON*(p[j+degree-1]-p[j]) )
          k = p[j+half_degree];
      }
      p[j] = k;
    }

    // step 3: determine where g[0] maximizes NURBS basis functions
    {
      double* B = (double*)alloca(order*order*sizeof(B[0]));
      double maxB  = 0.0;
      int maxBj = 0;
      for ( j = 0; j < 2*degree; j++ ) {
        if ( g[0] > p[j+degree] )
          continue;
        if ( g[0] < p[j+degree-1] )
          break;
        ON_EvaluateNurbsBasis( order, p+j, g[0], B );
        if ( B[0] > maxB ) {
          maxB  = B[0];
          maxBj = j;
        }
      }
      memcpy( knot, &p[maxBj], knot_count*sizeof(*knot) );
    }

    rc = ON_MakeKnotVectorPeriodic( order, cv_count, knot );
  }
  else {
    // clamped knots
    rc = true;
    if ( g > knot && g < knot+knot_count ) {
      p = (double*)onmalloc(cv_count*sizeof(*p));
      for( j = 0; j < cv_count; j++ ) {
        p[j] = g[j*g_stride];
      }
      g = p;
      g_stride = 1;
    }
    for ( ki = 0; ki < degree; ki++ ) {
      knot[ki] = g[0];
    }
    for ( ki = degree, gi = 1; ki < cv_count; ki++, gi++ ) {
      k = 0.0;
      for ( j = 0; j < degree; j++ ) {
        k += g[(gi+j)*g_stride];
      }
      knot[ki] = k*dd;
      if ( knot[ki] < knot[ki-1] || knot[ki] <= knot[ki-degree] ) {
        rc = false;
      }
    }
    for ( ki = cv_count-1; ki < knot_count; ki++ ) {
      knot[ki] = g[(cv_count-1)*g_stride];
    }
  }

  if (p)
    onfree(p);
  return rc;
}